

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smprintf.c
# Opt level: O0

char * smprintf(char *fmt,...)

{
  bool bVar1;
  char in_AL;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [8];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_4c;
  undefined4 local_48;
  int x;
  va_list ap;
  char *pcStack_20;
  int didnt_fit;
  char *buf;
  int m;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_100 = in_RSI;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  sVar2 = strlen(fmt);
  buf._4_4_ = (int)sVar2 * 2 + 1;
  pcStack_20 = (char *)malloc((long)buf._4_4_);
  do {
    ap[0].overflow_arg_area = local_108;
    ap[0]._0_8_ = &stack0x00000008;
    x = 0x30;
    local_48 = 8;
    local_4c = vsnprintf(pcStack_20,(long)buf._4_4_,fmt,&local_48);
    if (local_4c < buf._4_4_) {
      if ((local_4c < 0) || (local_4c == buf._4_4_ + -1)) {
        buf._4_4_ = buf._4_4_ << 1;
        pcStack_20 = (char *)realloc(pcStack_20,(long)buf._4_4_);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      buf._4_4_ = local_4c + 1;
      pcStack_20 = (char *)realloc(pcStack_20,(long)buf._4_4_);
      bVar1 = true;
    }
  } while (bVar1);
  return pcStack_20;
}

Assistant:

char *smprintf (const char *fmt, ...) {
	int m = strlen (fmt) * 2 + 1;
	char *buf = (char *) malloc (m);
	int didnt_fit;
	do {
		va_list ap;
		int x;
		va_start (ap, fmt);
		x = vsnprintf (buf, m, fmt, ap);
		va_end (ap);
		if (x >= m) {
			buf = (char *) realloc (buf, m = x+1);
			didnt_fit = 1;
		} else if (x < 0 || x == m-1) {
			buf = (char *) realloc (buf, m *= 2);
			didnt_fit = 1;
		} else {
			didnt_fit = 0;
		}
	} while (didnt_fit);
	return (buf);
}